

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# python_generator.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::python::Generator::
FixContainingTypeInDescriptor<google::protobuf::Descriptor>
          (Generator *this,Descriptor *descriptor,Descriptor *containing_descriptor)

{
  undefined1 local_60 [8];
  string parent_name;
  string nested_name;
  Descriptor *containing_descriptor_local;
  Descriptor *descriptor_local;
  Generator *this_local;
  
  if (containing_descriptor != (Descriptor *)0x0) {
    ModuleLevelDescriptorName<google::protobuf::Descriptor>
              ((string *)((long)&parent_name.field_2 + 8),this,descriptor);
    ModuleLevelDescriptorName<google::protobuf::Descriptor>
              ((string *)local_60,this,containing_descriptor);
    io::Printer::Print(this->printer_,"$nested_name$.containing_type = $parent_name$;\n",
                       "nested_name",(string *)((long)&parent_name.field_2 + 8),"parent_name",
                       (string *)local_60);
    std::__cxx11::string::~string((string *)local_60);
    std::__cxx11::string::~string((string *)(parent_name.field_2._M_local_buf + 8));
  }
  return;
}

Assistant:

void Generator::FixContainingTypeInDescriptor(
    const DescriptorT& descriptor,
    const Descriptor* containing_descriptor) const {
  if (containing_descriptor != NULL) {
    const string nested_name = ModuleLevelDescriptorName(descriptor);
    const string parent_name = ModuleLevelDescriptorName(
        *containing_descriptor);
    printer_->Print(
        "$nested_name$.containing_type = $parent_name$;\n",
        "nested_name", nested_name,
        "parent_name", parent_name);
  }
}